

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ChildWindowComparer(void *lhs,void *rhs)

{
  long lVar1;
  long lVar2;
  int d_1;
  int d;
  ImGuiWindow *b;
  ImGuiWindow *a;
  void *rhs_local;
  void *lhs_local;
  int local_4;
  
  lVar1 = *lhs;
  lVar2 = *rhs;
  local_4 = (*(uint *)(lVar1 + 0xc) & 0x4000000) - (*(uint *)(lVar2 + 0xc) & 0x4000000);
  if ((local_4 == 0) &&
     (local_4 = (*(uint *)(lVar1 + 0xc) & 0x2000000) - (*(uint *)(lVar2 + 0xc) & 0x2000000),
     local_4 == 0)) {
    local_4 = (int)*(short *)(lVar1 + 0xa6) - (int)*(short *)(lVar2 + 0xa6);
  }
  return local_4;
}

Assistant:

static int IMGUI_CDECL ChildWindowComparer(const void* lhs, const void* rhs)
{
    const ImGuiWindow* const a = *(const ImGuiWindow* const *)lhs;
    const ImGuiWindow* const b = *(const ImGuiWindow* const *)rhs;
    if (int d = (a->Flags & ImGuiWindowFlags_Popup) - (b->Flags & ImGuiWindowFlags_Popup))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_Tooltip) - (b->Flags & ImGuiWindowFlags_Tooltip))
        return d;
    return (a->BeginOrderWithinParent - b->BeginOrderWithinParent);
}